

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_file_get_contents(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_user_func *pjVar1;
  jx9_io_stream *pStream;
  void *pvVar2;
  jx9_int64 jVar3;
  char *pcVar4;
  jx9_value *pjVar5;
  jx9_vm *pVm;
  int use_include;
  long lVar6;
  sxi64 sVar7;
  jx9_int64 jVar8;
  char *zFile;
  int nLen;
  char zBuf [8192];
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar4 = "Expecting a file path";
LAB_0013e686:
    jx9VmThrowError(pVm,&pjVar1->sName,2,pcVar4);
  }
  else {
    zFile = jx9_value_to_string(*apArg,&nLen);
    pVm = pCtx->pVm;
    pStream = jx9VmGetStreamDevice(pVm,&zFile,nLen);
    if (pStream == (jx9_io_stream *)0x0) {
      pjVar1 = pCtx->pFunc;
      pcVar4 = "No such stream device, JX9 is returning FALSE";
      goto LAB_0013e686;
    }
    use_include = 0;
    if (nArg != 1) {
      pjVar5 = apArg[1];
      jx9MemObjToBool(pjVar5);
      use_include = *(int *)&pjVar5->x;
    }
    pcVar4 = zFile;
    if (nArg < 3) {
      pjVar5 = (jx9_value *)0x0;
    }
    else {
      pjVar5 = apArg[2];
    }
    pvVar2 = jx9StreamOpenHandle(pCtx->pVm,pStream,zFile,1,use_include,pjVar5,0,(int *)0x0);
    if (pvVar2 != (void *)0x0) {
      sVar7 = -1;
      if (3 < nArg) {
        pjVar5 = apArg[3];
        jx9MemObjToInteger(pjVar5);
        lVar6 = (pjVar5->x).iVal;
        if ((0 < lVar6) && (pStream->xSeek != (_func_int_void_ptr_jx9_int64_int *)0x0)) {
          (*pStream->xSeek)(pvVar2,lVar6,0);
        }
        if (nArg != 4) {
          pjVar5 = apArg[4];
          jx9MemObjToInteger(pjVar5);
          sVar7 = (pjVar5->x).iVal;
        }
      }
      jVar8 = 0x2000;
      if (sVar7 - 1U < 0x1fff) {
        jVar8 = sVar7;
      }
      lVar6 = 0;
      do {
        jVar3 = (*pStream->xRead)(pvVar2,zBuf,jVar8);
        if (jVar3 < 1) break;
        jx9_value_string(pCtx->pRet,zBuf,(int)jVar3);
        lVar6 = lVar6 + jVar3;
      } while ((sVar7 < 1) || (lVar6 < sVar7));
      if (pStream->xClose != (_func_void_void_ptr *)0x0) {
        (*pStream->xClose)(pvVar2);
      }
      pjVar5 = pCtx->pRet;
      if ((pjVar5->sBlob).nByte != 0) {
        return 0;
      }
      goto LAB_0013e694;
    }
    jx9_context_throw_error_format(pCtx,1,"IO error while opening \'%s\'",pcVar4);
  }
  pjVar5 = pCtx->pRet;
LAB_0013e694:
  jx9MemObjRelease(pjVar5);
  (pjVar5->x).rVal = 0.0;
  pjVar5->iFlags = pjVar5->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_file_get_contents(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	jx9_int64 n, nRead, nMaxlen;
	int use_include  = FALSE;
	const char *zFile;
	char zBuf[8192];
	void *pHandle;
	int nLen;
	
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pStream == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	nMaxlen = -1;
	if( nArg > 1 ){
		use_include = jx9_value_to_bool(apArg[1]);
	}
	/* Try to open the file in read-only mode */
	pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zFile, JX9_IO_OPEN_RDONLY, use_include, nArg > 2 ? apArg[2] : 0, FALSE, 0);
	if( pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( nArg > 3 ){
		/* Extract the offset */
		n = jx9_value_to_int64(apArg[3]);
		if( n > 0 ){
			if( pStream->xSeek ){
				/* Seek to the desired offset */
				pStream->xSeek(pHandle, n, 0/*SEEK_SET*/);
			}
		}
		if( nArg > 4 ){
			/* Maximum data to read */
			nMaxlen = jx9_value_to_int64(apArg[4]);
		}
	}
	/* Perform the requested operation */
	nRead = 0;
	for(;;){
		n = pStream->xRead(pHandle, zBuf, 
			(nMaxlen > 0 && (nMaxlen < sizeof(zBuf))) ? nMaxlen : sizeof(zBuf));
		if( n < 1 ){
			/* EOF or IO error, break immediately */
			break;
		}
		/* Append data */
		jx9_result_string(pCtx, zBuf, (int)n);
		/* Increment read counter */
		nRead += n;
		if( nMaxlen > 0 && nRead >= nMaxlen ){
			/* Read limit reached */
			break;
		}
	}
	/* Close the stream */
	jx9StreamCloseHandle(pStream, pHandle);
	/* Check if we have read something */
	if( jx9_context_result_buf_length(pCtx) < 1 ){
		/* Nothing read, return FALSE */
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}